

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# WindowBase.cpp
# Opt level: O0

void __thiscall sf::WindowBase::create(WindowBase *this,VideoMode mode,String *title,Uint32 style)

{
  VideoMode mode_00;
  bool bVar1;
  WindowBase *pWVar2;
  ostream *poVar3;
  vector<sf::VideoMode,_std::allocator<sf::VideoMode>_> *this_00;
  const_reference pvVar4;
  WindowImpl *pWVar5;
  uint in_ECX;
  uint in_EDX;
  WindowBase *in_RDI;
  uint in_R8D;
  undefined4 uVar6;
  undefined4 in_stack_ffffffffffffff74;
  undefined4 in_stack_ffffffffffffff90;
  undefined4 in_stack_ffffffffffffff94;
  ContextSettings *in_stack_ffffffffffffffa0;
  Uint32 in_stack_ffffffffffffffac;
  String *in_stack_ffffffffffffffb0;
  uint local_4;
  
  (*in_RDI->_vptr_WindowBase[4])();
  local_4 = in_EDX;
  if ((in_R8D & 8) != 0) {
    pWVar2 = getFullscreenWindow(in_RDI);
    if (pWVar2 == (WindowBase *)0x0) {
      bVar1 = VideoMode::isValid((VideoMode *)
                                 CONCAT44(in_stack_ffffffffffffff94,in_stack_ffffffffffffff90));
      if (!bVar1) {
        poVar3 = err();
        poVar3 = std::operator<<(poVar3,
                                 "The requested video mode is not available, switching to a valid mode"
                                );
        std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
        this_00 = VideoMode::getFullscreenModes();
        pvVar4 = std::vector<sf::VideoMode,_std::allocator<sf::VideoMode>_>::operator[](this_00,0);
        local_4 = pvVar4->bitsPerPixel;
      }
      setFullscreenWindow(in_RDI,in_RDI);
    }
    else {
      poVar3 = err();
      poVar3 = std::operator<<(poVar3,
                               "Creating two fullscreen windows is not allowed, switching to windowed mode"
                              );
      std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
      in_R8D = in_R8D & 0xfffffff7;
    }
  }
  if (((in_R8D & 4) != 0) || ((in_R8D & 2) != 0)) {
    in_R8D = in_R8D | 1;
  }
  uVar6 = 0;
  ContextSettings::ContextSettings
            ((ContextSettings *)&stack0xffffffffffffffa4,0,0,0,0,0,0xffffffff,false);
  mode_00.height = in_R8D;
  mode_00.width = local_4;
  mode_00.bitsPerPixel = in_ECX;
  pWVar5 = priv::WindowImpl::create
                     (mode_00,in_stack_ffffffffffffffb0,in_stack_ffffffffffffffac,
                      in_stack_ffffffffffffffa0);
  in_RDI->m_impl = pWVar5;
  initialize((WindowBase *)CONCAT44(in_stack_ffffffffffffff74,uVar6));
  return;
}

Assistant:

void WindowBase::create(VideoMode mode, const String& title, Uint32 style)
{
    // Destroy the previous window implementation
    close();

    // Fullscreen style requires some tests
    if (style & Style::Fullscreen)
    {
        // Make sure there's not already a fullscreen window (only one is allowed)
        if (getFullscreenWindow())
        {
            err() << "Creating two fullscreen windows is not allowed, switching to windowed mode" << std::endl;
            style &= ~static_cast<Uint32>(Style::Fullscreen);
        }
        else
        {
            // Make sure that the chosen video mode is compatible
            if (!mode.isValid())
            {
                err() << "The requested video mode is not available, switching to a valid mode" << std::endl;
                mode = VideoMode::getFullscreenModes()[0];
            }

            // Update the fullscreen window
            setFullscreenWindow(this);
        }
    }

    // Check validity of style according to the underlying platform
    #if defined(SFML_SYSTEM_IOS) || defined(SFML_SYSTEM_ANDROID)
        if (style & Style::Fullscreen)
            style &= ~static_cast<Uint32>(Style::Titlebar);
        else
            style |= Style::Titlebar;
    #else
        if ((style & Style::Close) || (style & Style::Resize))
            style |= Style::Titlebar;
    #endif

    // Recreate the window implementation
    m_impl = priv::WindowImpl::create(mode, title, style, ContextSettings(0, 0, 0, 0, 0, 0xFFFFFFFF, false));

    // Perform common initializations
    initialize();
}